

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

int secp256k1_jacobi64_maybe_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint len;
  long lVar15;
  uint uVar16;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  long lStack_60;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[4] = (modinfo->modulus).v[4];
  local_88.v[0] = (modinfo->modulus).v[0];
  local_88.v[1] = (modinfo->modulus).v[1];
  local_88.v[2] = (modinfo->modulus).v[2];
  local_88.v[3] = (modinfo->modulus).v[3];
  local_58.v[4] = x->v[4];
  local_58.v[0] = x->v[0];
  local_58.v[1] = x->v[1];
  local_58.v[2] = x->v[2];
  local_58.v[3] = x->v[3];
  len = 5;
  lVar15 = -1;
  iVar9 = 0;
  uVar16 = 0;
  do {
    lVar7 = 0;
    if ((local_58.v[0] | 0xc000000000000000U) != 0) {
      for (; ((local_58.v[0] | 0xc000000000000000U) >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
      }
    }
    lVar15 = lVar15 - lVar7;
    uVar16 = ((uint)((ulong)local_88.v[0] >> 1) ^ (uint)((ulong)local_88.v[0] >> 2)) & (uint)lVar7 ^
             uVar16;
    if (lVar7 == 0x3e) {
      local_a8.r = 1;
      local_a8.q = 0;
      local_a8.u = 0x4000000000000000;
      local_a8.v = 0;
    }
    else {
      uVar6 = local_88.v[1] << 0x3e | local_88.v[0];
      local_a8.r = 1;
      local_a8.u = 1L << ((byte)lVar7 & 0x3f);
      uVar10 = (ulong)(local_58.v[1] << 0x3e | local_58.v[0]) >> ((byte)lVar7 & 0x3f);
      iVar2 = 0x3e - (uint)lVar7;
      local_a8.v = 0;
      lVar7 = 0;
      do {
        iVar8 = (int)uVar6;
        iVar12 = (int)uVar10;
        bVar4 = (byte)iVar2;
        if (lVar15 < 0) {
          lVar15 = -lVar15;
          uVar16 = uVar16 ^ (uint)((uVar6 & uVar10) >> 1);
          iVar5 = (int)lVar15 + 1;
          bVar3 = (byte)iVar5;
          if (iVar2 <= iVar5) {
            bVar3 = bVar4;
          }
          uVar11 = (uint)(0xffffffffffffffff >> (-bVar3 & 0x3f)) &
                   (iVar12 * iVar12 + 0x3e) * iVar8 * iVar12 & 0x3f;
          local_a8.q = local_a8.u;
          uVar13 = uVar6;
          uVar6 = uVar10;
          lVar14 = local_a8.r;
        }
        else {
          iVar5 = (int)lVar15 + 1;
          bVar3 = (byte)iVar5;
          if (iVar2 <= iVar5) {
            bVar3 = bVar4;
          }
          uVar11 = (uint)(0xffffffffffffffff >> (-bVar3 & 0x3f)) &
                   -(((iVar8 * 2 + 2U & 8) + iVar8) * iVar12) & 0xf;
          local_a8.q = lVar7;
          uVar13 = uVar10;
          lVar7 = local_a8.u;
          lVar14 = local_a8.v;
          local_a8.v = local_a8.r;
        }
        uVar10 = (ulong)uVar11;
        uVar13 = uVar10 * uVar6 + uVar13;
        local_a8.q = lVar7 * uVar10 + local_a8.q;
        local_a8.r = uVar10 * lVar14 + local_a8.v;
        uVar10 = -1L << (bVar4 & 0x3f) | uVar13;
        lVar1 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
          }
        }
        bVar4 = (byte)lVar1;
        uVar10 = uVar13 >> (bVar4 & 0x3f);
        local_a8.u = lVar7 << (bVar4 & 0x3f);
        local_a8.v = lVar14 << (bVar4 & 0x3f);
        lVar15 = lVar15 - lVar1;
        uVar16 = ((uint)(uVar6 >> 1) ^ (uint)(uVar6 >> 2)) & (uint)lVar1 ^ uVar16;
        iVar2 = iVar2 - (uint)lVar1;
        lVar7 = local_a8.q;
      } while (iVar2 != 0);
    }
    secp256k1_modinv64_update_fg_62_var(len,&local_88,&local_58,&local_a8);
    if (local_88.v[0] == 1) {
      if ((int)len < 2) {
LAB_0015e39a:
        return 1 - (uVar16 * 2 & 2);
      }
      uVar6 = 1;
      uVar10 = 0;
      do {
        uVar10 = uVar10 | local_88.v[uVar6];
        uVar6 = uVar6 + 1;
      } while (len != uVar6);
      if (uVar10 == 0) goto LAB_0015e39a;
    }
    lVar7 = (long)(int)len;
    uVar11 = len - 1;
    if ((lVar7 + -2 < 0 || local_88.v[lVar7 + -1] != 0) || (&lStack_60)[lVar7] != 0) {
      uVar11 = len;
    }
    len = uVar11;
    iVar9 = iVar9 + 1;
    if (iVar9 == 0x19) {
      return 0;
    }
  } while( true );
}

Assistant:

static int secp256k1_jacobi64_maybe_var(const secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4]) != 0);

    for (count = 0; count < JACOBI64_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 62 posdivsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_posdivsteps_62_var(eta, f.v[0] | ((uint64_t)f.v[1] << 62), g.v[0] | ((uint64_t)g.v[1] << 62), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. When f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1550 iterations. Return 0, indicating unknown result. */
    return 0;
}